

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O3

void xmlFreeAttribute(xmlAttributePtr attr)

{
  _xmlEnumeration *p_Var1;
  xmlEnumerationPtr pxVar2;
  int iVar3;
  xmlChar *pxVar4;
  _xmlDict *dict;
  
  if (attr == (xmlAttributePtr)0x0) {
    return;
  }
  if (attr->doc == (_xmlDoc *)0x0) {
    dict = (xmlDictPtr)0x0;
  }
  else {
    dict = attr->doc->dict;
  }
  xmlUnlinkNode((xmlNodePtr)attr);
  pxVar2 = attr->tree;
  while (pxVar2 != (xmlEnumerationPtr)0x0) {
    p_Var1 = pxVar2->next;
    (*xmlFree)(pxVar2->name);
    (*xmlFree)(pxVar2);
    pxVar2 = p_Var1;
  }
  pxVar4 = attr->elem;
  if (dict == (xmlDictPtr)0x0) {
    if (pxVar4 != (xmlChar *)0x0) {
      (*xmlFree)(pxVar4);
    }
    if (attr->name != (xmlChar *)0x0) {
      (*xmlFree)(attr->name);
    }
    if (attr->defaultValue != (xmlChar *)0x0) {
      (*xmlFree)(attr->defaultValue);
    }
    pxVar4 = attr->prefix;
    if (pxVar4 == (xmlChar *)0x0) goto LAB_001587ad;
  }
  else {
    if ((pxVar4 != (xmlChar *)0x0) && (iVar3 = xmlDictOwns(dict,pxVar4), iVar3 == 0)) {
      (*xmlFree)(attr->elem);
    }
    if ((attr->name != (xmlChar *)0x0) && (iVar3 = xmlDictOwns(dict,attr->name), iVar3 == 0)) {
      (*xmlFree)(attr->name);
    }
    if ((attr->prefix != (xmlChar *)0x0) && (iVar3 = xmlDictOwns(dict,attr->prefix), iVar3 == 0)) {
      (*xmlFree)(attr->prefix);
    }
    if ((attr->defaultValue == (xmlChar *)0x0) ||
       (iVar3 = xmlDictOwns(dict,attr->defaultValue), iVar3 != 0)) goto LAB_001587ad;
    pxVar4 = attr->defaultValue;
  }
  (*xmlFree)(pxVar4);
LAB_001587ad:
  (*xmlFree)(attr);
  return;
}

Assistant:

static void
xmlFreeAttribute(xmlAttributePtr attr) {
    xmlDictPtr dict;

    if (attr == NULL) return;
    if (attr->doc != NULL)
	dict = attr->doc->dict;
    else
	dict = NULL;
    xmlUnlinkNode((xmlNodePtr) attr);
    if (attr->tree != NULL)
        xmlFreeEnumeration(attr->tree);
    if (dict) {
        if ((attr->elem != NULL) && (!xmlDictOwns(dict, attr->elem)))
	    xmlFree((xmlChar *) attr->elem);
        if ((attr->name != NULL) && (!xmlDictOwns(dict, attr->name)))
	    xmlFree((xmlChar *) attr->name);
        if ((attr->prefix != NULL) && (!xmlDictOwns(dict, attr->prefix)))
	    xmlFree((xmlChar *) attr->prefix);
        if ((attr->defaultValue != NULL) &&
	    (!xmlDictOwns(dict, attr->defaultValue)))
	    xmlFree((xmlChar *) attr->defaultValue);
    } else {
	if (attr->elem != NULL)
	    xmlFree((xmlChar *) attr->elem);
	if (attr->name != NULL)
	    xmlFree((xmlChar *) attr->name);
	if (attr->defaultValue != NULL)
	    xmlFree((xmlChar *) attr->defaultValue);
	if (attr->prefix != NULL)
	    xmlFree((xmlChar *) attr->prefix);
    }
    xmlFree(attr);
}